

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::Int64ToDoubleMap::MergePartialFromCodedStream
          (Int64ToDoubleMap *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  uint8 *puVar3;
  bool bVar4;
  uint32 uVar5;
  int iVar6;
  pair<int,_int> pVar7;
  uint tag;
  ulong uVar8;
  Map<long,_double> *pMVar9;
  Parser<google::protobuf::internal::MapFieldLite<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::Map<long,_double>_>
  parser;
  Parser<google::protobuf::internal::MapFieldLite<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::Map<long,_double>_>
  local_58;
  
  pMVar9 = &(this->map_).map_;
  do {
    pbVar2 = input->buffer_;
    uVar5 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar5 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_001dcaa9;
      input->buffer_ = pbVar2 + 1;
      uVar8 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_001dcaa9:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar8 = 0;
      if (uVar5 - 1 < 0x7f) {
        uVar8 = 0x100000000;
      }
      uVar8 = uVar5 | uVar8;
    }
    tag = (uint)uVar8;
    if (((uVar8 & 0x100000000) == 0) || ((char)uVar8 != '\n' || (tag & 0xfffffff8) != 8)) {
      iVar6 = 7;
      if ((tag & 7) != 4 && tag != 0) {
        bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,tag);
        if (bVar4) goto LAB_001dcba8;
        iVar6 = 6;
      }
    }
    else {
      local_58.entry_.ptr_ =
           (MapEntryImpl<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
            *)0x0;
      puVar3 = input->buffer_;
      local_58.mf_ = &this->map_;
      local_58.map_ = pMVar9;
      if ((puVar3 < input->buffer_end_) && (iVar6 = (int)(char)*puVar3, -1 < (char)*puVar3)) {
        input->buffer_ = puVar3 + 1;
        bVar4 = true;
      }
      else {
        iVar6 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar4 = -1 < iVar6;
      }
      if (((bVar4) &&
          (pVar7 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                             (input,iVar6), -1 < (long)pVar7)) &&
         (bVar4 = google::protobuf::internal::
                  MapEntryImpl<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
                  ::
                  Parser<google::protobuf::internal::MapFieldLite<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::Map<long,_double>_>
                  ::MergePartialFromCodedStream(&local_58,input), bVar4)) {
        bVar4 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                          (input,pVar7.first);
      }
      else {
        bVar4 = false;
      }
      iVar6 = 6;
      if (bVar4 != false) {
        iVar6 = 0;
      }
      if (local_58.entry_.ptr_ !=
          (MapEntryImpl<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
           *)0x0) {
        (*((local_58.entry_.ptr_)->super_MessageLite)._vptr_MessageLite[1])();
      }
      if (bVar4 != false) {
LAB_001dcba8:
        iVar6 = 0;
      }
    }
    if (iVar6 != 0) {
      return iVar6 != 6;
    }
  } while( true );
}

Assistant:

bool Int64ToDoubleMap::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.Int64ToDoubleMap)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // map<int64, double> map = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          Int64ToDoubleMap_MapEntry::Parser< ::google::protobuf::internal::MapFieldLite<
              Int64ToDoubleMap_MapEntry,
              ::google::protobuf::int64, double,
              ::google::protobuf::internal::WireFormatLite::TYPE_INT64,
              ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE,
              0 >,
            ::google::protobuf::Map< ::google::protobuf::int64, double > > parser(&map_);
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
              input, &parser));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.Int64ToDoubleMap)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.Int64ToDoubleMap)
  return false;
#undef DO_
}